

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::toString<std::_Rb_tree_const_iterator<std::__cxx11::string>>
          (string *__return_storage_ptr__,Catch *this,
          _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *value)

{
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *value_local;
  
  Detail::makeString<std::_Rb_tree_const_iterator<std::__cxx11::string>>
            (__return_storage_ptr__,(Detail *)this,value);
  return __return_storage_ptr__;
}

Assistant:

std::string toString( const T& value ) {
    return Detail::makeString( value );
}